

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

char * __thiscall google::protobuf::FastInt32ToBufferLeft(protobuf *this,int32 i,char *buffer)

{
  char *pcVar1;
  undefined4 in_register_00000034;
  
  if ((int)this < 0) {
    *(undefined1 *)CONCAT44(in_register_00000034,i) = 0x2d;
    pcVar1 = FastUInt32ToBufferLeft((protobuf *)(ulong)(uint)-(int)this,i + 1,buffer);
    return pcVar1;
  }
  pcVar1 = FastUInt32ToBufferLeft(this,i,buffer);
  return pcVar1;
}

Assistant:

char* FastInt32ToBufferLeft(int32 i, char* buffer) {
  uint32 u = 0;
  if (i < 0) {
    *buffer++ = '-';
    u -= i;
  } else {
    u = i;
  }
  return FastUInt32ToBufferLeft(u, buffer);
}